

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbQueue.cpp
# Opt level: O2

void __thiscall Hpipe::CbQueue::write_some(CbQueue *this,CbQueue *cq)

{
  Buffer *pBVar1;
  ulong uVar2;
  
  uVar2 = (ulong)cq->off;
  if (uVar2 != 0) {
    write_some(this,cq->beg->data + uVar2,cq->beg->used - uVar2);
    pBVar1 = cq->beg->next;
    Buffer::dec_ref(cq->beg);
    cq->beg = pBVar1;
  }
  if (this->beg == (Buffer *)0x0) {
    this->beg = cq->beg;
    this->off = 0;
  }
  else {
    this->end->next = cq->beg;
  }
  this->end = cq->end;
  cq->beg = (Buffer *)0x0;
  cq->end = (Buffer *)0x8;
  cq->off = 0;
  return;
}

Assistant:

void CbQueue::write_some( CbQueue &&cq ) {
    if ( cq.off ) {
        write_some( cq.beg->data + cq.off, cq.beg->used - cq.off );
        Buffer *n = cq.beg->next;
        Buffer::dec_ref( cq.beg );
        cq.beg = n;
    }

    if ( not beg ) {
        beg = cq.beg;
        off = 0;
    } else {
        end->next = cq.beg;
    }
    end = cq.end;

    // we don't want to dec_ref the buffers of cq (which are now used in this)
    new ( &cq ) CbQueue;
}